

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

int AF_AActor_TraceBleedAngle
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  char *pcVar2;
  AActor *target;
  DAngle local_28;
  DAngle local_20;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_0041e8d6;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    target = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (target != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)target,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0041e8d6;
        }
        goto LAB_0041e85d;
      }
    }
    else if (target != (AActor *)0x0) goto LAB_0041e8c6;
    target = (AActor *)0x0;
LAB_0041e85d:
    if (numparam == 1) {
      pcVar2 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\0') {
        if ((uint)numparam < 3) {
          pcVar2 = "(paramnum) < numparam";
        }
        else {
          if (param[2].field_0.field_3.Type == '\x01') {
            if (numparam == 3) {
              pcVar2 = "(paramnum) < numparam";
            }
            else {
              if (param[3].field_0.field_3.Type == '\x01') {
                local_20.Degrees = (double)param[2].field_0.field_1.a;
                local_28.Degrees = (double)param[3].field_0.field_1.a;
                P_TraceBleed(param[1].field_0.i,target,&local_20,&local_28);
                return 0;
              }
              pcVar2 = "param[paramnum].Type == REGT_FLOAT";
            }
            __assert_fail(pcVar2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                          ,0x1279,
                          "int AF_AActor_TraceBleedAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pcVar2 = "param[paramnum].Type == REGT_FLOAT";
        }
        __assert_fail(pcVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                      ,0x1278,
                      "int AF_AActor_TraceBleedAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pcVar2 = "param[paramnum].Type == REGT_INT";
    }
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1277,
                  "int AF_AActor_TraceBleedAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_0041e8c6:
  pcVar2 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0041e8d6:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                ,0x1276,
                "int AF_AActor_TraceBleedAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, TraceBleedAngle)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(damage);
	PARAM_FLOAT(angle);
	PARAM_FLOAT(pitch);

	P_TraceBleed(damage, self, angle, pitch);
	return 0;
}